

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::select_multiple::element::element(element *this)

{
  uint *in_RDI;
  basic_message<char> *this_00;
  
  *in_RDI = *in_RDI & 0xfffffffe;
  *(byte *)in_RDI = (byte)*in_RDI & 0xfd;
  *(byte *)in_RDI = (byte)*in_RDI & 0xfb;
  this_00 = (basic_message<char> *)(in_RDI + 2);
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::string::string((string *)(in_RDI + 10));
  booster::locale::basic_message<char>::basic_message(this_00);
  return;
}

Assistant:

select_multiple::element::element():
	selected(0),
	need_translation(0),
	original_select(0)
{
}